

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  ulong uVar2;
  byte *pbVar3;
  unsigned_short *puVar4;
  byte bVar5;
  unsigned_short *puVar6;
  longlong *plVar7;
  longlong *plVar8;
  longlong *plVar9;
  size_t __n;
  pointer puVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  int iVar13;
  int iVar14;
  uchar *puVar15;
  mz_ulong __n_00;
  uchar **ppuVar16;
  void *pvVar17;
  longlong **pplVar18;
  long *plVar19;
  longlong *hcode;
  undefined8 uVar20;
  byte *pbVar21;
  uchar **ppuVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uchar **ppuVar27;
  ulong uVar28;
  ushort uVar29;
  float fVar30;
  uint uVar31;
  value_type_conflict1 *__val;
  uchar **__s;
  ushort *puVar32;
  int iVar33;
  ulong uVar34;
  ushort uVar35;
  int iVar36;
  pointer pPVar37;
  longlong **pplVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uchar **ppuVar42;
  ulong uVar43;
  int iVar44;
  void *pvVar45;
  uchar **ppuVar46;
  int *piVar47;
  ushort *puVar48;
  byte bVar49;
  uint uVar50;
  int *piVar51;
  short bs_1;
  uint uVar52;
  ushort *puVar53;
  ushort *puVar54;
  long lVar55;
  ushort uVar56;
  uint uVar57;
  uint uVar58;
  value_type_conflict3 *__val_1;
  long lVar59;
  ushort *puVar60;
  short as;
  uint uVar61;
  ulong uVar62;
  pointer pPVar63;
  ulong uVar64;
  value_type *__val_3;
  pointer pPVar65;
  unsigned_short *puVar66;
  int i_1;
  bool bVar67;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000001c;
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  void *local_1a0;
  ulong local_198;
  allocator_type local_189;
  ushort *local_188;
  uchar **local_180;
  ulong local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  void *local_158;
  ushort *local_150;
  uint local_144;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  ushort *local_128;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_120;
  longlong **local_108;
  ulong local_100;
  long local_f8;
  ulong local_f0;
  uint local_e8;
  int local_e4;
  uchar **local_e0;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_d8;
  long local_d0;
  long local_c8;
  ushort *local_c0;
  longlong **local_b8;
  uint local_ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  void *local_90;
  void *local_88;
  uchar **local_80;
  pointer local_78;
  void *local_70;
  ushort *local_68;
  long local_60;
  ulong local_58;
  pointer local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_1a0 = (void *)CONCAT44(local_1a0._4_4_,width);
  pPVar63 = (pointer)(ulong)(uint)param_4;
  local_f0 = CONCAT44(local_f0._4_4_,compression_type);
  local_188 = (ushort *)(long)x_stride;
  __s = (uchar **)CONCAT44(in_stack_0000001c,num_lines);
  ppuVar16 = (uchar **)CONCAT44(in_stack_00000014,line_no);
  lVar59 = (long)param_4;
  local_d8 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_140,(long)local_188 * lVar59 * (long)ppuVar16,(allocator_type *)&local_170);
  uVar11 = local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
  iVar13 = (int)local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  puVar15 = *__s;
  local_150 = (ushort *)CONCAT44(local_150._4_4_,param_4);
  pPVar65 = pPVar63;
  if (__s[1] != puVar15) {
    lVar25 = (long)width;
    local_1a0 = (void *)((ulong)local_188 & 0xffffffff);
    local_128 = (ushort *)(param_6 * lVar25 * 4);
    local_108 = (longlong **)(param_6 * lVar25 * 2);
    local_158 = (void *)(lVar25 * 2);
    uVar62 = 0;
    __s = ppuVar16;
    do {
      lVar26 = uVar62 * 0x38;
      iVar14 = *(int *)(puVar15 + lVar26 + 0x20);
      if (iVar14 == 2) {
        if (*(int *)(puVar15 + lVar26 + 0x24) == 1) {
          if (0 < (int)(uint)local_188) {
            pbVar21 = (byte *)0x0;
            pvVar45 = (void *)0x0;
            puVar32 = local_128;
            do {
              lVar26 = *(long *)(*(long *)pixel_data_size + uVar62 * 8);
              if ((ulong)(CONCAT44(local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_140.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pvVar45 * (long)__s + lVar26) * lVar59)) goto LAB_0010fce2;
              if (0 < param_4) {
                lVar26 = CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                         (long)(pbVar21 + lVar26) * lVar59;
                pPVar37 = (pointer)0x0;
                do {
                  uVar61 = *(uint *)(images[uVar62] + (long)puVar32 + (long)pPVar37 * 4);
                  uVar39 = uVar61 >> 0x17;
                  uVar41 = uVar39 & 0xff;
                  if ((char)uVar39 != '\0') {
                    if (uVar41 == 0xff) {
                      uVar41 = ((uVar61 & 0x7fffff) != 0 | 0x3e) << 9;
                    }
                    else {
                      uVar40 = 0x7c00;
                      if (uVar41 < 0x8f) {
                        if (uVar41 < 0x71) {
                          uVar40 = 0;
                          if (uVar41 < 0x66) goto LAB_0010e5db;
                          uVar50 = uVar61 & 0x7fffff | 0x800000;
                          uVar40 = uVar50 >> (0x7eU - (char)uVar39 & 0x1f);
                          uVar50 = uVar50 >> (0x7d - uVar41 & 0x1f);
                        }
                        else {
                          uVar40 = (uVar61 >> 0xd & 0x3ff | (uVar39 & 0x1f) << 10) ^ 0x4000;
                          uVar50 = uVar61 >> 0xc;
                        }
                        uVar40 = uVar40 + ((uVar50 & 1) != 0);
                      }
LAB_0010e5db:
                      uVar41 = uVar40 & 0x7fff;
                      pPVar65 = (pointer)(ulong)uVar41;
                    }
                  }
                  *(char *)(lVar26 + (long)pPVar37 * 2) = (char)uVar41;
                  *(byte *)(lVar26 + 1 + (long)pPVar37 * 2) =
                       (byte)(uVar61 >> 0x18) & 0x80 | (byte)(uVar41 >> 8);
                  pPVar37 = (pointer)((long)&pPVar37->start + 1);
                } while (pPVar63 != pPVar37);
              }
              pvVar45 = (void *)((long)pvVar45 + 1);
              __s = (uchar **)CONCAT44(in_stack_00000014,line_no);
              pbVar21 = pbVar21 + (long)__s;
              puVar32 = puVar32 + lVar25 * 2;
            } while (pvVar45 != local_1a0);
          }
        }
        else {
          if (*(int *)(puVar15 + lVar26 + 0x24) != 2) {
LAB_0010ea84:
            if (channels !=
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
              std::__cxx11::string::append((char *)channels);
            }
            goto LAB_0010f833;
          }
          if (0 < (int)(uint)local_188) {
            pbVar21 = (byte *)0x0;
            pvVar45 = (void *)0x0;
            puVar32 = local_128;
            do {
              lVar26 = *(long *)(*(long *)pixel_data_size + uVar62 * 8);
              if ((ulong)(CONCAT44(local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_140.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pvVar45 * (long)__s + lVar26) * lVar59)) goto LAB_0010fcd4;
              if (0 < param_4) {
                pPVar37 = (pointer)0x0;
                do {
                  *(undefined4 *)
                   (CONCAT44(local_140.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                    (long)(pbVar21 + lVar26) * lVar59 + (long)pPVar37 * 4) =
                       *(undefined4 *)(images[uVar62] + (long)puVar32 + (long)pPVar37 * 4);
                  pPVar37 = (pointer)((long)&pPVar37->start + 1);
                } while (pPVar63 != pPVar37);
              }
              pvVar45 = (void *)((long)pvVar45 + 1);
              __s = (uchar **)CONCAT44(in_stack_00000014,line_no);
              pbVar21 = pbVar21 + (long)__s;
              puVar32 = puVar32 + lVar25 * 2;
            } while (pvVar45 != local_1a0);
          }
        }
      }
      else if (iVar14 == 1) {
        if (*(int *)(puVar15 + lVar26 + 0x24) == 2) {
          if (0 < (int)(uint)local_188) {
            pbVar21 = (byte *)0x0;
            pvVar45 = (void *)0x0;
            pplVar18 = local_108;
            do {
              lVar26 = *(long *)(*(long *)pixel_data_size + uVar62 * 8);
              if ((ulong)(CONCAT44(local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_140.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pvVar45 * (long)__s + lVar26) * lVar59)) goto LAB_0010fcf0;
              if (0 < param_4) {
                lVar26 = CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                         (long)(pbVar21 + lVar26) * lVar59;
                pPVar37 = (pointer)0x0;
                do {
                  uVar29 = *(ushort *)(images[uVar62] + (long)pplVar18 + (long)pPVar37 * 2);
                  uVar61 = (uint)uVar29 << 0xd;
                  if ((uVar61 & 0xf800000) == 0xf800000) {
                    fVar30 = (float)(uVar61 | 0x70000000);
                  }
                  else if ((uVar61 & 0xf800000) == 0) {
                    fVar30 = (float)(uVar61 | 0x38800000) + -6.1035156e-05;
                  }
                  else {
                    fVar30 = (float)((uVar61 & 0xfffe000) + 0x38000000);
                  }
                  *(char *)(lVar26 + (long)pPVar37 * 4) = SUB41(fVar30,0);
                  *(char *)(lVar26 + 1 + (long)pPVar37 * 4) = (char)((uint)fVar30 >> 8);
                  *(char *)(lVar26 + 2 + (long)pPVar37 * 4) = (char)((uint)fVar30 >> 0x10);
                  *(byte *)(lVar26 + 3 + (long)pPVar37 * 4) =
                       (byte)((short)uVar29 >> 0xf) & 0x80 | (byte)((uint)fVar30 >> 0x18);
                  pPVar37 = (pointer)((long)&pPVar37->start + 1);
                } while (pPVar63 != pPVar37);
              }
              pvVar45 = (void *)((long)pvVar45 + 1);
              __s = (uchar **)CONCAT44(in_stack_00000014,line_no);
              pbVar21 = pbVar21 + (long)__s;
              pplVar18 = (longlong **)((long)pplVar18 + (long)local_158);
            } while (pvVar45 != local_1a0);
          }
        }
        else {
          if (*(int *)(puVar15 + lVar26 + 0x24) != 1) goto LAB_0010ea84;
          if (0 < (int)(uint)local_188) {
            pbVar21 = (byte *)0x0;
            pvVar45 = (void *)0x0;
            pplVar18 = local_108;
            do {
              lVar26 = *(long *)(*(long *)pixel_data_size + uVar62 * 8);
              if ((ulong)(CONCAT44(local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_140.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pvVar45 * (long)__s + lVar26) * lVar59)) goto LAB_0010fcfe;
              if (0 < param_4) {
                pPVar37 = (pointer)0x0;
                do {
                  *(undefined2 *)
                   (CONCAT44(local_140.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                    (long)(pbVar21 + lVar26) * lVar59 + (long)pPVar37 * 2) =
                       *(undefined2 *)(images[uVar62] + (long)pplVar18 + (long)pPVar37 * 2);
                  pPVar37 = (pointer)((long)&pPVar37->start + 1);
                } while (pPVar63 != pPVar37);
              }
              pvVar45 = (void *)((long)pvVar45 + 1);
              __s = (uchar **)CONCAT44(in_stack_00000014,line_no);
              pbVar21 = pbVar21 + (long)__s;
              pplVar18 = (longlong **)((long)pplVar18 + (long)local_158);
            } while (pvVar45 != local_1a0);
          }
        }
      }
      else if ((iVar14 == 0) && (0 < (int)(uint)local_188)) {
        pbVar21 = (byte *)0x0;
        pvVar45 = (void *)0x0;
        puVar32 = local_128;
        do {
          lVar26 = *(long *)(*(long *)pixel_data_size + uVar62 * 8);
          if ((ulong)(CONCAT44(local_140.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)local_140.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) -
                     CONCAT44(local_140.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) <=
              (ulong)(((long)pvVar45 * (long)__s + lVar26) * lVar59)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_0010fcd4;
          }
          if (0 < param_4) {
            pPVar37 = (pointer)0x0;
            do {
              *(undefined4 *)
               (CONCAT44(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)local_140.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) +
                (long)(pbVar21 + lVar26) * lVar59 + (long)pPVar37 * 4) =
                   *(undefined4 *)(images[uVar62] + (long)puVar32 + (long)pPVar37 * 4);
              pPVar37 = (pointer)((long)&pPVar37->start + 1);
            } while (pPVar63 != pPVar37);
          }
          pvVar45 = (void *)((long)pvVar45 + 1);
          __s = (uchar **)CONCAT44(in_stack_00000014,line_no);
          pbVar21 = pbVar21 + (long)__s;
          puVar32 = puVar32 + lVar25 * 2;
        } while (pvVar45 != local_1a0);
      }
      uVar62 = uVar62 + 1;
      puVar15 = *(uchar **)CONCAT44(in_stack_0000001c,num_lines);
    } while (uVar62 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - (long)puVar15 >>
                              3) * 0x6db6db6db6db6db7));
  }
  if ((uint)local_f0 == 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_d8,*(undefined8 *)(local_d8 + 8),
               CONCAT44(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_140.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),
               CONCAT44(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_140.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
LAB_0010fca1:
    bVar67 = true;
    goto LAB_0010fca3;
  }
  if (((uint)local_f0 & 0xfffffffe) == 2) {
    __n_00 = mz_compressBound(CONCAT44(local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)local_140.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) -
                              CONCAT44(local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_140.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,__n_00,
               (allocator_type *)&local_170);
    pPVar65 = local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __s = (uchar **)
          ((long)local_120.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start);
    if (__s == (uchar **)0x0) {
LAB_0010fd0c:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fd1e:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fd30:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      pvVar45 = (void *)CONCAT44(local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_140.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pbVar21 = (byte *)CONCAT44(local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_140.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      images = (uchar **)(pbVar21 + -(long)pvVar45);
      if (images == (uchar **)0x0) goto LAB_0010fd0c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_170,(size_type)images,(allocator_type *)&local_a8);
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010fd1e;
      if (0 < (long)images) {
        lVar59 = 0;
        do {
          pbVar3 = (byte *)((long)pvVar45 + lVar59 * 2);
          *(byte *)((long)local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar59) = *pbVar3;
          if (pbVar21 <= pbVar3 + 1) break;
          *(byte *)((long)local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   lVar59 + ((ulong)((long)images + 1U) >> 1)) = pbVar3[1];
          lVar59 = lVar59 + 1;
        } while (pbVar3 + 2 < pbVar21);
      }
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010fd30;
      if (1 < (long)images) {
        pbVar21 = (byte *)((long)local_170.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        bVar49 = *local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar5 = *pbVar21;
          *pbVar21 = (bVar5 - bVar49) + 0x80;
          pbVar21 = pbVar21 + 1;
          bVar49 = bVar5;
        } while (pbVar21 < (byte *)((long)local_170.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + (long)images))
        ;
      }
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)mz_compressBound((mz_ulong)images);
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar13 = mz_compress((uchar *)pPVar65,(mz_ulong *)&local_a8,
                             local_170.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(mz_ulong)images);
        if ((iVar13 == 0) &&
           (__s = (uchar **)
                  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
           images <= local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)) {
          memcpy(pPVar65,pvVar45,(size_t)images);
          __s = images;
        }
        if ((uchar **)
            local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar **)0x0) {
          operator_delete(local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (iVar13 == 0) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_d8,*(undefined8 *)(local_d8 + 8),
                     local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (uchar *)((long)&(local_120.
                                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->start +
                              ((ulong)__s & 0xffffffff)));
        }
        else if (channels !=
                 (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
          std::__cxx11::string::append((char *)channels);
        }
        if (local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar13 != 0) goto LAB_0010f833;
        goto LAB_0010fca1;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fd54:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fd66:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fd78:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fd8a:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010fda3:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    pPVar63 = pPVar65;
LAB_0010fdb3:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    if ((uint)local_f0 == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
LAB_0010f833:
      bVar67 = false;
LAB_0010fca3:
      if ((void *)CONCAT44(local_140.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_140.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_140.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      return bVar67;
    }
    if ((uint)local_f0 != 4) {
      if ((uint)local_f0 != 1) goto LAB_0010f833;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
                 (ulong)((CONCAT44(local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_140.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_140.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_140.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) * 3) >> 1,
                 (allocator_type *)&local_170);
      pPVar65 = local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __s = (uchar **)
            ((long)local_120.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_120.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      if (__s == (uchar **)0x0) goto LAB_0010fd54;
      pvVar45 = (void *)CONCAT44(local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_140.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pbVar21 = (byte *)CONCAT44(local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_140.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      images = (uchar **)(pbVar21 + -(long)pvVar45);
      if (images == (uchar **)0x0) goto LAB_0010fd54;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_170,(size_type)images,(allocator_type *)&local_a8);
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010fd66;
      if (0 < (long)images) {
        lVar59 = 0;
        do {
          pbVar3 = (byte *)((long)pvVar45 + lVar59 * 2);
          *(byte *)((long)local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar59) = *pbVar3;
          if (pbVar21 <= pbVar3 + 1) break;
          *(byte *)((long)local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   lVar59 + ((ulong)((long)images + 1U) >> 1)) = pbVar3[1];
          lVar59 = lVar59 + 1;
        } while (pbVar3 + 2 < pbVar21);
      }
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010fd78;
      if (1 < (long)images) {
        pbVar21 = (byte *)((long)local_170.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        bVar49 = *local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar5 = *pbVar21;
          *pbVar21 = (bVar5 - bVar49) + 0x80;
          pbVar21 = pbVar21 + 1;
          bVar49 = bVar5;
        } while (pbVar21 < (byte *)((long)local_170.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + (long)images))
        ;
      }
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar63 = pPVar65;
        if (0 < (int)images) {
          ppuVar22 = (uchar **)
                     ((long)(int)images +
                     (long)local_170.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
          ppuVar16 = (uchar **)
                     local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppuVar27 = (uchar **)
                     local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          do {
            pbVar21 = (byte *)(~(ulong)ppuVar16 + (long)ppuVar27);
            lVar59 = 1;
            lVar25 = 0;
            do {
              lVar55 = lVar25;
              lVar26 = lVar59;
              ppuVar42 = (uchar **)((long)ppuVar16 + lVar55 + 1);
              if (ppuVar22 <= ppuVar42) {
                pbVar21 = (byte *)((long)ppuVar16 + (lVar55 - (long)ppuVar27) + 1);
                ppuVar46 = ppuVar42;
                if ((long)pbVar21 < 3) goto LAB_0010ea3c;
                goto LAB_0010ea15;
              }
              if ((long)pbVar21 < -0x7f) break;
              pbVar21 = pbVar21 + -1;
              lVar59 = lVar26 + 1;
              lVar25 = lVar55 + 1;
            } while (*(byte *)ppuVar27 == *(byte *)ppuVar42);
            pbVar21 = (byte *)((long)ppuVar16 + ((lVar55 + 1) - (long)ppuVar27));
            if ((long)pbVar21 < 3) {
              ppuVar46 = (uchar **)((long)ppuVar16 + lVar55 + 2);
              bVar49 = *(byte *)ppuVar42;
              if (ppuVar46 < ppuVar22) {
                do {
                  lVar59 = lVar26;
                  ppuVar42 = (uchar **)((long)ppuVar16 + lVar59 + 2);
                  bVar5 = *(byte *)((long)ppuVar16 + lVar59 + 1);
                  if ((bVar49 == bVar5) && (ppuVar42 < ppuVar22)) {
                    if ((0x7e < (long)((long)ppuVar16 + (lVar59 - (long)ppuVar27))) ||
                       (bVar49 == *(byte *)((long)ppuVar16 + lVar59 + 2))) goto LAB_0010ea32;
                  }
                  else if (0x7e < (long)((long)ppuVar16 + (lVar59 - (long)ppuVar27))) {
LAB_0010ea32:
                    ppuVar46 = (uchar **)((long)ppuVar16 + lVar59);
                    goto LAB_0010ea3c;
                  }
                  lVar26 = lVar59 + 1;
                  bVar49 = bVar5;
                } while (ppuVar42 < ppuVar22);
                ppuVar46 = (uchar **)((long)ppuVar16 + lVar59 + 2);
                if (0x7e < (long)((long)ppuVar16 + (lVar26 - (long)ppuVar27))) {
                  ppuVar46 = (uchar **)((long)ppuVar16 + lVar26);
                }
              }
LAB_0010ea3c:
              ppuVar16 = ppuVar46;
              *(char *)&pPVar63->start = (char)ppuVar27 - (char)ppuVar16;
              pPVar63 = (pointer)((long)&pPVar63->start + 1);
              if (ppuVar27 < ppuVar16) {
                lVar59 = (long)ppuVar16 - (long)ppuVar27;
                do {
                  bVar49 = *(byte *)ppuVar27;
                  ppuVar27 = (uchar **)((long)ppuVar27 + 1);
                  *(byte *)&pPVar63->start = bVar49;
                  pPVar63 = (pointer)((long)&pPVar63->start + 1);
                  lVar59 = lVar59 + -1;
                } while (lVar59 != 0);
              }
            }
            else {
LAB_0010ea15:
              *(uchar *)&pPVar63->start = (char)pbVar21 + 0xff;
              *(byte *)((long)&pPVar63->start + 1) = *(byte *)ppuVar27;
              pPVar63 = (pointer)((long)&pPVar63->start + 2);
              ppuVar27 = (uchar **)((long)ppuVar16 + lVar55 + 1);
              ppuVar16 = ppuVar27;
            }
          } while (ppuVar27 < ppuVar22);
        }
        uVar61 = (int)pPVar63 - (int)pPVar65;
        if ((0 < (int)uVar61) &&
           (__s = (uchar **)(ulong)(uVar61 & 0x7fffffff),
           images <= (uchar **)(ulong)(uVar61 & 0x7fffffff))) {
          memcpy(pPVar65,pvVar45,(size_t)images);
          __s = images;
        }
        if ((uchar **)
            local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar **)0x0) {
          operator_delete(local_170.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((int)uVar61 < 1) {
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_d8,*(undefined8 *)(local_d8 + 8),
                     local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (uchar *)((long)&(local_120.
                                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->start +
                              ((ulong)__s & 0xffffffff)));
        }
        if (local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (0 < (int)uVar61) goto LAB_0010fca1;
        goto LAB_0010f833;
      }
      goto LAB_0010fd8a;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a8,
               (ulong)(((int)local_140.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_140.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
               (allocator_type *)&local_170);
    puVar32 = local_188;
    local_80 = (uchar **)
               local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0010fda3;
    local_88 = (void *)CONCAT44(local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_140.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    pPVar65 = (pointer)(CONCAT44(local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_140.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish) - (long)local_88);
    if (pPVar65 == (pointer)0x0) goto LAB_0010fda3;
    __s = (uchar **)operator_new(0x2000);
    memset(__s,0,0x2000);
    local_180 = __s;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_170,
               (ulong)pPVar65 >> 1,(allocator_type *)&local_120);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&local_120,
               (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                *(long *)CONCAT44(in_stack_0000001c,num_lines) >> 3) * 0x6db6db6db6db6db7,&local_189
              );
    pPVar63 = pPVar65;
    images = (uchar **)
             local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0010fdb3;
    iVar13 = (int)puVar32;
    if ((long)local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar59 = (long)local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar59 = lVar59 + (ulong)(lVar59 == 0);
      piVar47 = (int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + 0x24);
      piVar51 = &(local_120.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size;
      ppuVar16 = (uchar **)
                 local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      do {
        ((PIZChannelData *)(piVar51 + -7))->start = (unsigned_short *)ppuVar16;
        *(uchar ***)(piVar51 + -5) = ppuVar16;
        piVar51[-3] = (int)local_150;
        piVar51[-2] = iVar13;
        iVar14 = *piVar47;
        *piVar51 = (iVar14 != 1) + 1;
        ppuVar16 = (uchar **)((long)ppuVar16 + (long)(iVar13 * (int)local_150 << (iVar14 != 1)) * 2)
        ;
        piVar47 = piVar47 + 0xe;
        piVar51 = piVar51 + 8;
        lVar59 = lVar59 + -1;
      } while (lVar59 != 0);
    }
    pPVar63 = local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_50 = pPVar65;
    if (0 < iVar13) {
      pPVar65 = local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar17 = (void *)0x0;
      pvVar45 = local_88;
      do {
        local_1a0 = pvVar17;
        bVar67 = pPVar65 != pPVar63;
        pPVar65 = pPVar63;
        if (bVar67) {
          lVar59 = 8;
          uVar62 = 0;
          do {
            lVar25 = (long)*(int *)((long)&pPVar63->ny + lVar59) *
                     (long)*(int *)((long)&pPVar63->end + lVar59);
            __n = lVar25 * 2;
            memcpy(*(void **)((long)&pPVar63->start + lVar59),pvVar45,__n);
            pvVar45 = (void *)((long)pvVar45 + lVar25 * 2);
            plVar19 = (long *)((long)&pPVar63->start + lVar59);
            *plVar19 = *plVar19 + __n;
            uVar62 = uVar62 + 1;
            lVar59 = lVar59 + 0x20;
            pPVar65 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar63 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar62 < (ulong)((long)local_120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar61 = (int)local_1a0 + 1;
        pvVar17 = (void *)(ulong)uVar61;
      } while (uVar61 != (uint)local_188);
    }
    puVar10 = local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppuVar16 = local_180;
    __s = (uchar **)
          ((long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start >> 1);
    images = (uchar **)
             local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar49 = 0;
      memset(local_180,0,0x2000);
      if (0 < (int)(uint)__s) {
        uVar62 = 0;
        do {
          uVar29 = *(ushort *)((long)puVar10 + uVar62 * 2);
          pbVar21 = (byte *)((long)ppuVar16 + (ulong)(uVar29 >> 3));
          *pbVar21 = *pbVar21 | (byte)(1 << ((byte)uVar29 & 7));
          uVar62 = uVar62 + 1;
        } while (((uint)__s & 0x7fffffff) != uVar62);
        bVar49 = *(byte *)ppuVar16 & 0xfe;
      }
      *(byte *)ppuVar16 = bVar49;
      pPVar63 = (pointer)CONCAT62((int6)((ulong)ppuVar16 >> 0x10),0x1fff);
      uVar39 = 0;
      uVar61 = 0;
      pPVar65 = (pointer)0x0;
      do {
        if (*(byte *)((long)local_180 + (long)pPVar65) != 0) {
          pPVar63 = (pointer)((ulong)pPVar63 & 0xffff);
          if (pPVar65 < pPVar63) {
            pPVar63 = (pointer)((ulong)pPVar65 & 0xffffffff);
            uVar61 = uVar39;
          }
          if ((pointer)(ulong)(uVar61 & 0xffff) < pPVar65) {
            uVar61 = (uint)pPVar65;
            uVar39 = (uint)pPVar65;
          }
        }
        pPVar65 = (pointer)((long)&pPVar65->start + 1);
      } while (pPVar65 != (pointer)0x2000);
      pvVar45 = operator_new(0x20000);
      uVar62 = 0;
      memset(pvVar45,0,0x20000);
      ppuVar16 = local_180;
      local_100 = 0;
      do {
        if ((uVar62 == 0) ||
           ((*(byte *)((long)local_180 + (uVar62 >> 3 & 0x1fffffff)) >> ((uint)uVar62 & 7) & 1) != 0
           )) {
          uVar12 = (undefined2)local_100;
          local_100 = (ulong)((int)local_100 + 1);
        }
        else {
          uVar12 = 0;
        }
        *(undefined2 *)((long)pvVar45 + uVar62 * 2) = uVar12;
        uVar62 = uVar62 + 1;
      } while (uVar62 != 0x10000);
      local_178 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 1;
      local_e0 = (uchar **)
                 local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      images = (uchar **)0x10000;
      local_90 = pvVar45;
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010fdd8;
      if (0 < (int)(uint)local_178) {
        uVar62 = 0;
        do {
          *(ushort *)
           ((long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar62 * 2) =
               *(ushort *)
                ((long)pvVar45 +
                (ulong)*(ushort *)
                        ((long)local_170.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar62 * 2) * 2);
          uVar62 = uVar62 + 1;
        } while (((uint)local_178 & 0x7fffffff) != uVar62);
      }
      *(ushort *)local_80 = (ushort)pPVar63;
      *(ushort *)((long)local_80 + 2) = (ushort)uVar39;
      puVar32 = (ushort *)((long)local_80 + 4);
      if ((ushort)pPVar63 <= (ushort)uVar39) {
        lVar59 = (ulong)(uVar39 & 0xffff) - ((ulong)pPVar63 & 0xffff);
        memcpy(puVar32,(byte *)((long)local_180 + ((ulong)pPVar63 & 0xffff)),lVar59 + 1);
        puVar32 = (ushort *)((long)puVar32 + lVar59 + 1);
      }
      local_78 = local_120.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar61 = (int)local_100 - 1;
        local_100 = (ulong)uVar61;
        local_48 = (long)local_120.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_120.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_48 = local_48 + (ulong)(local_48 == 0);
        lVar59 = 0;
        do {
          local_40 = lVar59;
          iVar13 = local_120.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_40].size;
          local_f8 = (long)iVar13;
          if (0 < local_f8) {
            pPVar65 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_40;
            puVar6 = pPVar65->start;
            uVar39 = pPVar65->nx;
            local_ac = pPVar65->ny;
            local_e4 = uVar39 * iVar13;
            local_188 = (ushort *)CONCAT44(local_188._4_4_,uVar39);
            local_e8 = local_ac;
            if ((int)uVar39 < (int)local_ac) {
              local_e8 = uVar39;
            }
            local_70 = (void *)0x0;
            local_c8 = 0;
            do {
              if (1 < (int)local_e8) {
                local_68 = puVar6 + local_c8;
                uVar62 = 2;
                uVar41 = 1;
                do {
                  local_58 = uVar62;
                  uVar50 = (uint)local_58;
                  iVar14 = (local_ac - uVar50) * local_e4;
                  local_60 = (long)(int)(uVar41 * iVar13);
                  lVar59 = (long)(int)(uVar50 * iVar13);
                  uVar40 = uVar61 & 0xffff;
                  puVar60 = local_68;
                  if (-1 < iVar14) {
                    local_128 = local_68 + iVar14;
                    iVar14 = (uVar39 - uVar50) * iVar13;
                    local_108 = (longlong **)CONCAT44(local_108._4_4_,iVar14);
                    local_38 = (long)iVar14;
                    lVar25 = (long)(int)(uVar41 * local_e4);
                    local_f0 = (ulong)(int)(uVar50 * local_e4);
                    local_b8 = (longlong **)(local_f0 * 2);
                    puVar4 = puVar6 + lVar25;
                    puVar66 = puVar6 + lVar25 + local_60;
                    pvVar45 = local_70;
                    do {
                      puVar53 = puVar60;
                      if (-1 < iVar14) {
                        pvVar17 = pvVar45;
                        do {
                          uVar29 = *(ushort *)((long)puVar6 + (long)pvVar17);
                          uVar56 = *(ushort *)((long)(puVar6 + local_60) + (long)pvVar17);
                          if (uVar40 < 0x4000) {
                            iVar44 = (int)(short)uVar29 - (int)(short)uVar56;
                            iVar33 = (int)*(short *)((long)puVar4 + (long)pvVar17) -
                                     (int)*(short *)((long)puVar66 + (long)pvVar17);
                            uVar57 = (int)(short)uVar56 + (int)(short)uVar29;
                            uVar31 = (int)*(short *)((long)puVar66 + (long)pvVar17) +
                                     (int)*(short *)((long)puVar4 + (long)pvVar17);
                            iVar36 = (uVar57 >> 1) - (uVar31 >> 1);
                            uVar29 = (ushort)((uint)(((int)uVar31 >> 1) + ((int)uVar57 >> 1)) >> 1);
                            uVar56 = (ushort)((uint)((int)(short)iVar33 + (int)(short)iVar44) >> 1);
                            iVar44 = iVar44 - iVar33;
                          }
                          else {
                            uVar52 = (uVar29 ^ 0x8000) - (uint)uVar56;
                            uVar31 = *(ushort *)((long)puVar4 + (long)pvVar17) ^ 0x8000;
                            uVar57 = uVar31 - *(ushort *)((long)puVar66 + (long)pvVar17);
                            uVar58 = uVar57 >> 0x10 & 0x8000 ^
                                     uVar31 + *(ushort *)((long)puVar66 + (long)pvVar17) >> 1;
                            uVar31 = (uVar29 ^ 0x8000) + (uint)uVar56 >> 1 ^ 0x8000 ^
                                     uVar52 >> 0x10 & 0x8000;
                            iVar36 = uVar31 - uVar58;
                            uVar29 = (ushort)((uint)iVar36 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar58 + uVar31 >> 1);
                            uVar31 = uVar52 & 0xffff ^ 0x8000;
                            uVar57 = uVar57 & 0xffff;
                            iVar44 = uVar31 - uVar57;
                            uVar56 = (ushort)((uint)iVar44 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar57 + uVar31 >> 1);
                          }
                          *(ushort *)((long)puVar6 + (long)pvVar17) = uVar29;
                          *(short *)((long)puVar4 + (long)pvVar17) = (short)iVar36;
                          *(ushort *)((long)(puVar6 + local_60) + (long)pvVar17) = uVar56;
                          *(short *)((long)puVar66 + (long)pvVar17) = (short)iVar44;
                          pvVar17 = (void *)((long)pvVar17 + lVar59 * 2);
                          puVar53 = (ushort *)((long)puVar6 + (long)pvVar17);
                          local_158 = pvVar45;
                          local_150 = puVar60;
                        } while (puVar53 <= puVar60 + local_38);
                      }
                      if ((uVar39 & uVar41) != 0) {
                        uVar29 = *puVar53;
                        uVar56 = puVar53[lVar25];
                        if (uVar40 < 0x4000) {
                          uVar35 = (ushort)((uint)((int)(short)uVar56 + (int)(short)uVar29) >> 1);
                          iVar36 = (int)(short)uVar29 - (int)(short)uVar56;
                        }
                        else {
                          iVar36 = (uVar29 ^ 0x8000) - (uint)uVar56;
                          uVar35 = (ushort)((uint)iVar36 >> 0x10) & 0x8000 ^
                                   (ushort)((uVar29 ^ 0x8000) + (uint)uVar56 >> 1);
                        }
                        puVar53[lVar25] = (ushort)iVar36;
                        *puVar53 = uVar35;
                      }
                      puVar60 = puVar60 + local_f0;
                      pvVar45 = (void *)((long)pvVar45 + (long)local_b8);
                      local_144 = uVar41;
                    } while (puVar60 <= local_128);
                  }
                  local_d0 = lVar59;
                  if (((uVar41 & local_ac) != 0) &&
                     (iVar14 = (uVar39 - uVar50) * iVar13, -1 < iVar14)) {
                    puVar53 = puVar60 + iVar14;
                    local_d0 = lVar59 * 2;
                    do {
                      uVar29 = *puVar60;
                      uVar56 = puVar60[local_60];
                      if (uVar40 < 0x4000) {
                        uVar35 = (ushort)((uint)((int)(short)uVar56 + (int)(short)uVar29) >> 1);
                        iVar14 = (int)(short)uVar29 - (int)(short)uVar56;
                      }
                      else {
                        iVar14 = (uVar29 ^ 0x8000) - (uint)uVar56;
                        uVar35 = (ushort)((uint)iVar14 >> 0x10) & 0x8000 ^
                                 (ushort)((uVar29 ^ 0x8000) + (uint)uVar56 >> 1);
                      }
                      puVar60[local_60] = (ushort)iVar14;
                      *puVar60 = uVar35;
                      puVar60 = puVar60 + lVar59;
                    } while (puVar60 <= puVar53);
                  }
                  uVar62 = (ulong)(uVar50 * 2);
                  ppuVar16 = local_180;
                  uVar41 = uVar50;
                } while ((int)(uVar50 * 2) <= (int)local_e8);
              }
              local_c8 = local_c8 + 1;
              local_70 = (void *)((long)local_70 + 2);
            } while (local_c8 != local_f8);
          }
          lVar59 = local_40 + 1;
        } while (local_40 + 1 != local_48);
      }
      puVar32[0] = 0;
      puVar32[1] = 0;
      puVar60 = puVar32 + 2;
      local_c0 = puVar32;
      if ((int)local_178 == 0) {
        iVar13 = 0;
      }
      else {
        pvVar45 = operator_new(0x80008);
        memset(pvVar45,0,0x80008);
        if (0 < (int)(uint)local_178) {
          uVar62 = 0;
          do {
            plVar19 = (long *)((long)pvVar45 + (ulong)*(ushort *)((long)local_e0 + uVar62 * 2) * 8);
            *plVar19 = *plVar19 + 1;
            uVar62 = uVar62 + 1;
          } while (((uint)local_178 & 0x7fffffff) != uVar62);
        }
        local_158 = operator_new(0x40004);
        memset(local_158,0,0x40004);
        pplVar18 = (longlong **)operator_new(0x80008);
        local_188 = puVar60;
        memset(pplVar18,0,0x80008);
        plVar19 = (long *)((long)pvVar45 + -8);
        uVar62 = 0xffffffffffffffff;
        do {
          uVar62 = uVar62 + 1;
          plVar1 = plVar19 + 1;
          plVar19 = plVar19 + 1;
        } while (*plVar1 == 0);
        local_198._0_4_ = 0;
        iVar13 = 0;
        if (uVar62 < 0x10001) {
          local_198 = 0;
          iVar13 = 0;
          uVar23 = uVar62;
          do {
            *(int *)((long)local_158 + uVar23 * 4) = (int)uVar23;
            if (*plVar19 != 0) {
              pplVar18[iVar13] = plVar19;
              iVar13 = iVar13 + 1;
              local_198 = uVar23 & 0xffffffff;
            }
            uVar23 = uVar23 + 1;
            plVar19 = plVar19 + 1;
          } while (uVar23 != 0x10001);
        }
        local_128 = (ushort *)(long)(int)local_198;
        local_150 = (ushort *)((long)pvVar45 + (long)local_128 * 8 + 8);
        *(undefined8 *)((long)pvVar45 + (long)local_128 * 8 + 8) = 1;
        pplVar18[iVar13] = (longlong *)local_150;
        std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (pplVar18,pplVar18 + (long)iVar13 + 1,
                   (_Iter_comp_iter<tinyexr::FHeapCompare> *)&local_189);
        hcode = (longlong *)operator_new(0x80008);
        memset(hcode,0,0x80008);
        if (0 < iVar13) {
          local_108 = pplVar18 + -1;
          uVar23 = (ulong)(iVar13 + 1);
          do {
            plVar7 = *pplVar18;
            plVar8 = pplVar18[uVar23 - 1];
            pplVar18[uVar23 - 1] = plVar7;
            std::
            __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                      (pplVar18,0,(long)((long)local_108 + (uVar23 * 8 - (long)pplVar18)) >> 3,
                       plVar8);
            uVar28 = uVar23 - 1;
            plVar8 = *pplVar18;
            pplVar38 = pplVar18 + (uVar23 - 1);
            uVar24 = uVar23;
            if (1 < uVar28) {
              plVar9 = pplVar18[uVar23 - 2];
              pplVar18[uVar23 - 2] = plVar8;
              local_f0 = uVar23;
              local_b8 = pplVar18 + (uVar23 - 1);
              std::
              __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                        (pplVar18,0,(long)(uVar23 * 8 + -0x10) >> 3,plVar9);
              pplVar38 = local_b8;
              uVar24 = local_f0;
            }
            uVar34 = (ulong)((long)plVar7 - (long)pvVar45) >> 3;
            uVar64 = (ulong)((long)plVar8 - (long)pvVar45) >> 3;
            plVar19 = (long *)((long)pvVar45 + (long)(int)uVar64 * 8);
            *plVar19 = *plVar19 + *(long *)((long)pvVar45 + (long)(int)uVar34 * 8);
            uVar23 = uVar24 - 2;
            plVar19 = pplVar38[-1];
            if (1 < uVar28) {
              lVar59 = *plVar19;
              do {
                uVar2 = uVar23 - 1;
                uVar43 = uVar2 >> 1;
                if (*pplVar18[uVar43] <= lVar59) goto LAB_0010f5a7;
                pplVar18[uVar23] = pplVar18[uVar43];
                uVar23 = uVar43;
              } while (1 < uVar2);
              uVar23 = 0;
            }
LAB_0010f5a7:
            pplVar18[uVar23] = plVar19;
            do {
              uVar61 = (uint)uVar64;
              lVar25 = (long)(int)uVar61;
              lVar59 = hcode[lVar25];
              hcode[lVar25] = lVar59 + 1;
              if (0x39 < lVar59) goto LAB_0010f623;
              uVar39 = *(uint *)((long)local_158 + lVar25 * 4);
              uVar64 = (ulong)uVar39;
            } while (uVar39 != uVar61);
            *(int *)((long)local_158 + lVar25 * 4) = (int)uVar34;
            do {
              uVar61 = (uint)uVar34;
              lVar25 = (long)(int)uVar61;
              lVar59 = hcode[lVar25];
              hcode[lVar25] = lVar59 + 1;
              if (0x39 < lVar59) goto LAB_0010f623;
              uVar39 = *(uint *)((long)local_158 + lVar25 * 4);
              uVar34 = (ulong)uVar39;
            } while (uVar39 != uVar61);
            uVar23 = uVar28;
          } while (2 < (long)uVar24);
        }
        hufCanonicalCodeTable(hcode);
        memcpy(pvVar45,hcode,0x80008);
LAB_0010f623:
        pvVar17 = local_158;
        lVar59 = (long)local_128 + 1;
        operator_delete(hcode);
        operator_delete(pplVar18);
        operator_delete(pvVar17);
        puVar32 = local_c0;
        ppuVar16 = local_180;
        puVar60 = local_188;
        puVar53 = local_c0 + 0xc;
        puVar48 = puVar53;
        if ((int)uVar62 <= (int)lVar59) {
          uVar23 = 0;
          uVar24 = uVar62 & 0xffffffff;
          uVar28 = 0;
          do {
            iVar14 = (int)uVar24;
            lVar25 = (long)iVar14;
            uVar24 = *(ulong *)((long)pvVar45 + lVar25 * 8) & 0x3f;
            iVar13 = (int)uVar23;
            if ((int)local_198 < iVar14 || uVar24 != 0) {
LAB_0010f6cb:
              uVar28 = uVar28 << 6 | uVar24;
              if (iVar13 < 2) {
LAB_0010f767:
                uVar23 = (ulong)(iVar13 + 6);
              }
              else {
                uVar23 = (ulong)(iVar13 + 6);
                do {
                  uVar23 = uVar23 - 8;
                  *(byte *)puVar48 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
                  puVar48 = (ushort *)((long)puVar48 + 1);
                } while (7 < uVar23);
              }
            }
            else {
              uVar61 = 1;
              while (uVar39 = uVar61, (*(byte *)((long)pvVar45 + lVar25 * 8 + 8) & 0x3f) == 0) {
                lVar25 = lVar25 + 1;
                uVar39 = uVar61 + 1;
                if ((lVar59 <= lVar25) || (bVar67 = 0x103 < uVar61, uVar61 = uVar39, bVar67)) break;
              }
              iVar14 = (int)lVar25;
              if (uVar39 < 2) goto LAB_0010f6cb;
              if (uVar39 < 6) {
                uVar28 = uVar28 << 6 | (ulong)(uVar39 + 0x39);
                if (1 < iVar13) {
                  uVar23 = (ulong)(iVar13 + 6);
                  do {
                    uVar23 = uVar23 - 8;
                    *(byte *)puVar48 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
                    puVar48 = (ushort *)((long)puVar48 + 1);
                  } while (7 < uVar23);
                  goto LAB_0010f769;
                }
                goto LAB_0010f767;
              }
              uVar23 = uVar28 << 6 | 0x3f;
              if (iVar13 < 2) {
                uVar28 = uVar23 << 8 | (ulong)(uVar39 - 6);
                uVar61 = iVar13 + 0xe;
                uVar23 = (ulong)uVar61;
                if ((int)(iVar13 + 6U) < 0) goto LAB_0010f769;
              }
              else {
                uVar28 = (ulong)(iVar13 + 6U);
                uVar61 = iVar13 + 0xe;
                do {
                  uVar28 = uVar28 - 8;
                  *(byte *)puVar48 = (byte)((long)uVar23 >> ((byte)uVar28 & 0x3f));
                  puVar48 = (ushort *)((long)puVar48 + 1);
                  uVar61 = uVar61 - 8;
                } while (7 < uVar28);
                uVar28 = uVar23 << 8 | (ulong)(uVar39 - 6);
              }
              uVar23 = (ulong)uVar61;
              do {
                uVar23 = uVar23 - 8;
                *(byte *)puVar48 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
                puVar48 = (ushort *)((long)puVar48 + 1);
              } while (7 < uVar23);
            }
LAB_0010f769:
            uVar24 = (ulong)(iVar14 + 1);
          } while (iVar14 <= (int)local_198);
          if (0 < (int)uVar23) {
            *(byte *)puVar48 = (byte)(uVar28 << (8U - (char)uVar23 & 0x3f));
            puVar48 = (ushort *)((long)puVar48 + 1);
          }
        }
        uVar29 = *(ushort *)local_e0;
        puVar54 = puVar48;
        if ((int)(uint)local_178 < 2) {
          uVar28 = 0;
          uVar23 = 0;
          iVar13 = 0;
        }
        else {
          local_178 = (ulong)((uint)local_178 & 0x7fffffff);
          iVar13 = 0;
          uVar24 = 1;
          uVar23 = 0;
          uVar28 = 0;
          do {
            if (iVar13 < 0xff && uVar29 == *(ushort *)((long)local_e0 + uVar24 * 2)) {
              iVar14 = iVar13 + 1;
            }
            else {
              lVar25 = *(long *)((long)pvVar45 + (ulong)uVar29 * 8);
              lVar26 = *(long *)local_150;
              uVar41 = (uint)lVar25;
              uVar39 = uVar41 & 0x3f;
              uVar61 = (uint)lVar26;
              uVar40 = uVar61 & 0x3f;
              uVar64 = (ulong)iVar13;
              uVar34 = lVar25 >> 6;
              if ((long)((ulong)uVar39 + (ulong)uVar40 + 8) < (long)(uVar39 * uVar64)) {
                uVar34 = uVar28 << (sbyte)uVar39 | uVar34;
                uVar39 = (uVar41 & 0x3f) + (int)uVar23;
                uVar23 = (ulong)uVar39;
                if (7 < (int)uVar39) {
                  uVar23 = (ulong)uVar39;
                  do {
                    uVar23 = uVar23 - 8;
                    *(byte *)puVar54 = (byte)((long)uVar34 >> ((byte)uVar23 & 0x3f));
                    puVar54 = (ushort *)((long)puVar54 + 1);
                  } while (7 < uVar23);
                }
                uVar61 = uVar61 & 0x3f;
                uVar28 = uVar34 << (sbyte)uVar40 | lVar26 >> 6;
                uVar39 = (int)uVar23 + uVar61;
                if ((int)uVar39 < 8) {
                  uVar61 = uVar39 + 8;
                  uVar23 = (ulong)uVar61;
                  uVar28 = uVar28 << 8 | uVar64;
                  if ((int)uVar39 < 0) {
                    iVar14 = 0;
                    goto LAB_0010f9ef;
                  }
                }
                else {
                  uVar34 = (ulong)uVar39;
                  uVar61 = uVar61 + (int)uVar23 + 8;
                  do {
                    uVar34 = uVar34 - 8;
                    *(byte *)puVar54 = (byte)((long)uVar28 >> ((byte)uVar34 & 0x3f));
                    puVar54 = (ushort *)((long)puVar54 + 1);
                    uVar61 = uVar61 - 8;
                  } while (7 < uVar34);
                  uVar28 = uVar28 << 8 | uVar64;
                }
                uVar23 = (ulong)uVar61;
                do {
                  uVar23 = uVar23 - 8;
                  *(byte *)puVar54 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
                  puVar54 = (ushort *)((long)puVar54 + 1);
                } while (7 < uVar23);
                iVar14 = 0;
              }
              else {
                iVar14 = 0;
                if (-1 < iVar13) {
                  do {
                    uVar61 = (int)uVar23 + (uVar41 & 0x3f);
                    uVar23 = (ulong)uVar61;
                    uVar28 = uVar28 << (sbyte)uVar39 | uVar34;
                    if (7 < (int)uVar61) {
                      uVar23 = (ulong)uVar61;
                      do {
                        uVar23 = uVar23 - 8;
                        *(byte *)puVar54 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
                        puVar54 = (ushort *)((long)puVar54 + 1);
                      } while (7 < uVar23);
                    }
                    bVar67 = 0 < iVar13;
                    iVar13 = iVar13 + -1;
                  } while (bVar67);
                }
              }
            }
LAB_0010f9ef:
            iVar13 = iVar14;
            uVar29 = *(ushort *)((long)local_e0 + uVar24 * 2);
            uVar24 = uVar24 + 1;
          } while (uVar24 != local_178);
        }
        lVar25 = *(long *)((long)pvVar45 + (ulong)uVar29 * 8);
        lVar26 = *(long *)local_150;
        uVar40 = (uint)lVar25;
        uVar39 = uVar40 & 0x3f;
        uVar61 = (uint)lVar26;
        uVar41 = uVar61 & 0x3f;
        uVar34 = (ulong)iVar13;
        uVar24 = lVar25 >> 6;
        if ((long)((ulong)uVar39 + (ulong)uVar41 + 8) < (long)(uVar39 * uVar34)) {
          uVar24 = uVar28 << (sbyte)uVar39 | uVar24;
          uVar39 = (uVar40 & 0x3f) + (int)uVar23;
          uVar23 = (ulong)uVar39;
          if (7 < (int)uVar39) {
            uVar23 = (ulong)uVar39;
            do {
              uVar23 = uVar23 - 8;
              *(byte *)puVar54 = (byte)((long)uVar24 >> ((byte)uVar23 & 0x3f));
              puVar54 = (ushort *)((long)puVar54 + 1);
            } while (7 < uVar23);
          }
          uVar61 = uVar61 & 0x3f;
          uVar28 = uVar24 << (sbyte)uVar41 | lVar26 >> 6;
          uVar39 = (int)uVar23 + uVar61;
          if ((int)uVar39 < 8) {
            uVar61 = uVar39 + 8;
            uVar23 = (ulong)uVar61;
            uVar28 = uVar28 << 8 | uVar34;
            if ((int)uVar39 < 0) goto LAB_0010fb5c;
          }
          else {
            uVar24 = (ulong)uVar39;
            uVar61 = uVar61 + (int)uVar23 + 8;
            do {
              uVar24 = uVar24 - 8;
              *(byte *)puVar54 = (byte)((long)uVar28 >> ((byte)uVar24 & 0x3f));
              puVar54 = (ushort *)((long)puVar54 + 1);
              uVar61 = uVar61 - 8;
            } while (7 < uVar24);
            uVar28 = uVar28 << 8 | uVar34;
          }
          uVar23 = (ulong)uVar61;
          do {
            uVar23 = uVar23 - 8;
            *(byte *)puVar54 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
            puVar54 = (ushort *)((long)puVar54 + 1);
          } while (7 < uVar23);
        }
        else if (-1 < iVar13) {
          do {
            uVar61 = (int)uVar23 + (uVar40 & 0x3f);
            uVar23 = (ulong)uVar61;
            uVar28 = uVar28 << (sbyte)uVar39 | uVar24;
            if (7 < (int)uVar61) {
              uVar23 = (ulong)uVar61;
              do {
                uVar23 = uVar23 - 8;
                *(byte *)puVar54 = (byte)((long)uVar28 >> ((byte)uVar23 & 0x3f));
                puVar54 = (ushort *)((long)puVar54 + 1);
              } while (7 < uVar23);
            }
            bVar67 = 0 < iVar13;
            iVar13 = iVar13 + -1;
          } while (bVar67);
        }
LAB_0010fb5c:
        iVar13 = (int)uVar23;
        if (iVar13 != 0) {
          *(byte *)puVar54 = (byte)(uVar28 << (8U - (char)uVar23 & 0x3f));
        }
        iVar44 = (int)puVar54 - (int)puVar48;
        lVar25 = (long)puVar48 - (long)puVar53;
        iVar36 = iVar13 + iVar44 * 8 + 7;
        iVar14 = iVar13 + iVar44 * 8 + 0xe;
        if (-1 < iVar36) {
          iVar14 = iVar36;
        }
        *(byte *)(local_c0 + 2) = (byte)uVar62;
        *(byte *)((long)local_c0 + 5) = (byte)(uVar62 >> 8);
        *(byte *)(local_c0 + 3) = (byte)(uVar62 >> 0x10);
        *(byte *)((long)local_c0 + 7) = (byte)(uVar62 >> 0x18);
        *(byte *)(local_c0 + 4) = (byte)lVar59;
        *(byte *)((long)local_c0 + 9) = (byte)((ulong)lVar59 >> 8);
        *(byte *)(local_c0 + 5) = (byte)((ulong)lVar59 >> 0x10);
        *(byte *)((long)local_c0 + 0xb) = (byte)((ulong)lVar59 >> 0x18);
        *(byte *)(local_c0 + 6) = (byte)lVar25;
        *(byte *)((long)local_c0 + 0xd) = (byte)((ulong)lVar25 >> 8);
        *(byte *)(local_c0 + 7) = (byte)((ulong)lVar25 >> 0x10);
        *(byte *)((long)local_c0 + 0xf) = (byte)((ulong)lVar25 >> 0x18);
        iVar13 = iVar13 + iVar44 * 8;
        *(byte *)(local_c0 + 8) = (byte)iVar13;
        *(byte *)((long)local_c0 + 0x11) = (byte)((uint)iVar13 >> 8);
        *(byte *)(local_c0 + 9) = (byte)((uint)iVar13 >> 0x10);
        *(byte *)((long)local_c0 + 0x13) = (byte)((uint)iVar13 >> 0x18);
        iVar13 = ((iVar14 >> 3) + (int)puVar48) - (int)local_188;
        local_c0[10] = 0;
        local_c0[0xb] = 0;
        operator_delete(pvVar45);
      }
      pPVar65 = local_50;
      *(int *)puVar32 = iVar13;
      pPVar63 = (pointer)(ulong)(uint)(((int)puVar60 - (int)local_80) + iVar13);
      if (local_50 <= pPVar63) {
        memcpy(local_80,local_88,(size_t)local_50);
        pPVar63 = (pointer)((ulong)pPVar65 & 0xffffffff);
      }
      operator_delete(local_90);
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((uchar **)
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar **)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(ppuVar16);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_d8,*(undefined8 *)(local_d8 + 8),
                 local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (byte *)((long)&pPVar63->start +
                         (long)local_a8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start));
      if ((uchar **)
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar **)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0010fca1;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,__s);
LAB_0010fdd8:
  uVar20 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0)
  ;
  operator_delete(images);
  operator_delete(pPVar63);
  operator_delete(local_158);
  operator_delete(local_1a0);
  operator_delete(local_90);
  if (local_120.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((uchar **)
      local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar **)0x0) {
    operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_180);
  if ((uchar **)
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar **)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)local_140.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_140.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_140.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  _Unwind_Resume(uVar20);
LAB_0010fcd4:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010fce2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010fcf0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010fcfe:
  __s = (uchar **)CONCAT44(uVar11,iVar13);
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_0010fd0c;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if defined(TINYEXR_USE_MINIZ) && (TINYEXR_USE_MINIZ==1)
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#elif defined(TINYEXR_USE_NANOZLIB) && (TINYEXR_USE_NANOZLIB == 1)
    std::vector<unsigned char> block(nanoz_compressBound(
      static_cast<unsigned long>(buf.size())));
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "RLE compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    if (!CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines)) {
      if (err) {
        (*err) += "PIZ compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}